

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

float tcu::sampleLevelArrayCubeSeamlessCompare
                (ConstPixelBufferAccess *(*faces) [6],int numLevels,CubeFace face,Sampler *sampler,
                float ref,float s,float t,float lod)

{
  int iVar1;
  int iVar2;
  float fVar3;
  ConstPixelBufferAccess *local_498;
  ConstPixelBufferAccess *local_480;
  ConstPixelBufferAccess *local_468;
  ConstPixelBufferAccess *local_450;
  FilterMode local_440;
  int local_43c;
  undefined1 local_438 [4];
  int i_2;
  ConstPixelBufferAccess faceAccesses1 [6];
  ConstPixelBufferAccess faceAccesses0 [6];
  float t1;
  float t0;
  float f;
  FilterMode levelFilter_1;
  int level1;
  int level0;
  int maxLevel_1;
  int i_1;
  ConstPixelBufferAccess faceAccesses_1 [6];
  FilterMode levelFilter;
  int level;
  int maxLevel;
  int i;
  ConstPixelBufferAccess faceAccesses [6];
  FilterMode filterMode;
  bool magnified;
  float lod_local;
  float t_local;
  float s_local;
  float ref_local;
  Sampler *sampler_local;
  CubeFace face_local;
  int numLevels_local;
  ConstPixelBufferAccess *(*faces_local) [6];
  
  if (sampler->lodThreshold < lod) {
    local_440 = sampler->minFilter;
  }
  else {
    local_440 = sampler->magFilter;
  }
  switch(local_440) {
  case NEAREST:
    faces_local._4_4_ = sampleCubeSeamlessNearestCompare((*faces)[face],sampler,ref,s,t,0);
    break;
  case LINEAR:
    local_450 = (ConstPixelBufferAccess *)&maxLevel;
    do {
      ConstPixelBufferAccess::ConstPixelBufferAccess(local_450);
      local_450 = local_450 + 1;
    } while (local_450 != (ConstPixelBufferAccess *)&faceAccesses[5].m_data);
    for (level = 0; level < 6; level = level + 1) {
      memcpy(&maxLevel + (long)level * 10,(*faces)[level],0x28);
    }
    faces_local._4_4_ =
         sampleCubeSeamlessLinearCompare
                   ((ConstPixelBufferAccess (*) [6])&maxLevel,face,sampler,ref,s,t);
    break;
  case NEAREST_MIPMAP_NEAREST:
  case LINEAR_MIPMAP_NEAREST:
    fVar3 = deFloatCeil(lod + 0.5);
    faceAccesses_1[5].m_data._4_4_ = deClamp32((int)fVar3 + -1,0,numLevels + -1);
    faceAccesses_1[5].m_data._0_4_ = (uint)(local_440 == LINEAR_MIPMAP_NEAREST);
    if ((uint)faceAccesses_1[5].m_data == 0) {
      faces_local._4_4_ =
           sampleCubeSeamlessNearestCompare
                     ((*faces)[face] + faceAccesses_1[5].m_data._4_4_,sampler,ref,s,t,0);
    }
    else {
      local_468 = (ConstPixelBufferAccess *)&maxLevel_1;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess(local_468);
        local_468 = local_468 + 1;
      } while (local_468 != (ConstPixelBufferAccess *)&faceAccesses_1[5].m_data);
      for (level0 = 0; level0 < 6; level0 = level0 + 1) {
        memcpy(&maxLevel_1 + (long)level0 * 10,(*faces)[level0] + faceAccesses_1[5].m_data._4_4_,
               0x28);
      }
      faces_local._4_4_ =
           sampleCubeSeamlessLinearCompare
                     ((ConstPixelBufferAccess (*) [6])&maxLevel_1,face,sampler,ref,s,t);
    }
    break;
  case NEAREST_MIPMAP_LINEAR:
  case LINEAR_MIPMAP_LINEAR:
    fVar3 = ::deFloatFloor(lod);
    iVar1 = deClamp32((int)fVar3,0,numLevels + -1);
    iVar2 = de::min<int>(numLevels + -1,iVar1 + 1);
    fVar3 = deFloatFrac(lod);
    if (local_440 == LINEAR_MIPMAP_LINEAR) {
      local_480 = (ConstPixelBufferAccess *)&faceAccesses1[5].m_data;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess(local_480);
        local_480 = local_480 + 1;
      } while (local_480 != (ConstPixelBufferAccess *)&faceAccesses0[5].m_data);
      local_498 = (ConstPixelBufferAccess *)local_438;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess(local_498);
        local_498 = local_498 + 1;
      } while (local_498 != (ConstPixelBufferAccess *)&faceAccesses1[5].m_data);
      for (local_43c = 0; local_43c < 6; local_43c = local_43c + 1) {
        memcpy(&faceAccesses1[(long)local_43c + 5].m_data,(*faces)[local_43c] + iVar1,0x28);
        memcpy(local_438 + (long)local_43c * 0x28,(*faces)[local_43c] + iVar2,0x28);
      }
      faceAccesses0[5].m_data._4_4_ =
           sampleCubeSeamlessLinearCompare
                     ((ConstPixelBufferAccess (*) [6])&faceAccesses1[5].m_data,face,sampler,ref,s,t)
      ;
      faceAccesses0[5].m_data._0_4_ =
           sampleCubeSeamlessLinearCompare
                     ((ConstPixelBufferAccess (*) [6])local_438,face,sampler,ref,s,t);
    }
    else {
      faceAccesses0[5].m_data._4_4_ =
           sampleCubeSeamlessNearestCompare((*faces)[face] + iVar1,sampler,ref,s,t,0);
      faceAccesses0[5].m_data._0_4_ =
           sampleCubeSeamlessNearestCompare((*faces)[face] + iVar2,sampler,ref,s,t,0);
    }
    faces_local._4_4_ =
         faceAccesses0[5].m_data._4_4_ * (1.0 - fVar3) + faceAccesses0[5].m_data._0_4_ * fVar3;
    break;
  default:
    faces_local._4_4_ = 0.0;
  }
  return faces_local._4_4_;
}

Assistant:

static float sampleLevelArrayCubeSeamlessCompare (const ConstPixelBufferAccess* const (&faces)[CUBEFACE_LAST], int numLevels, CubeFace face, const Sampler& sampler, float ref, float s, float t, float lod)
{
	bool					magnified	= lod <= sampler.lodThreshold;
	Sampler::FilterMode		filterMode	= magnified ? sampler.magFilter : sampler.minFilter;

	switch (filterMode)
	{
		case Sampler::NEAREST:
			return sampleCubeSeamlessNearestCompare(faces[face][0], sampler, ref, s, t);

		case Sampler::LINEAR:
		{
			ConstPixelBufferAccess faceAccesses[CUBEFACE_LAST];
			for (int i = 0; i < (int)CUBEFACE_LAST; i++)
				faceAccesses[i] = faces[i][0];

			return sampleCubeSeamlessLinearCompare(faceAccesses, face, sampler, ref, s, t);
		}

		case Sampler::NEAREST_MIPMAP_NEAREST:
		case Sampler::LINEAR_MIPMAP_NEAREST:
		{
			int						maxLevel	= (int)numLevels-1;
			int						level		= deClamp32((int)deFloatCeil(lod + 0.5f) - 1, 0, maxLevel);
			Sampler::FilterMode		levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_NEAREST) ? Sampler::LINEAR : Sampler::NEAREST;

			if (levelFilter == Sampler::NEAREST)
				return sampleCubeSeamlessNearestCompare(faces[face][level], sampler, ref, s, t);
			else
			{
				DE_ASSERT(levelFilter == Sampler::LINEAR);

				ConstPixelBufferAccess faceAccesses[CUBEFACE_LAST];
				for (int i = 0; i < (int)CUBEFACE_LAST; i++)
					faceAccesses[i] = faces[i][level];

				return sampleCubeSeamlessLinearCompare(faceAccesses, face, sampler, ref, s, t);
			}
		}

		case Sampler::NEAREST_MIPMAP_LINEAR:
		case Sampler::LINEAR_MIPMAP_LINEAR:
		{
			int						maxLevel	= (int)numLevels-1;
			int						level0		= deClamp32((int)deFloatFloor(lod), 0, maxLevel);
			int						level1		= de::min(maxLevel, level0 + 1);
			Sampler::FilterMode		levelFilter	= (filterMode == Sampler::LINEAR_MIPMAP_LINEAR) ? Sampler::LINEAR : Sampler::NEAREST;
			float					f			= deFloatFrac(lod);
			float					t0;
			float					t1;

			if (levelFilter == Sampler::NEAREST)
			{
				t0 = sampleCubeSeamlessNearestCompare(faces[face][level0], sampler, ref, s, t);
				t1 = sampleCubeSeamlessNearestCompare(faces[face][level1], sampler, ref, s, t);
			}
			else
			{
				DE_ASSERT(levelFilter == Sampler::LINEAR);

				ConstPixelBufferAccess faceAccesses0[CUBEFACE_LAST];
				ConstPixelBufferAccess faceAccesses1[CUBEFACE_LAST];
				for (int i = 0; i < (int)CUBEFACE_LAST; i++)
				{
					faceAccesses0[i] = faces[i][level0];
					faceAccesses1[i] = faces[i][level1];
				}

				t0 = sampleCubeSeamlessLinearCompare(faceAccesses0, face, sampler, ref, s, t);
				t1 = sampleCubeSeamlessLinearCompare(faceAccesses1, face, sampler, ref, s, t);
			}

			return t0*(1.0f - f) + t1*f;
		}

		default:
			DE_ASSERT(DE_FALSE);
			return 0.0f;
	}
}